

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O0

void AddObject(Level *level,Object *NewObject,int DisplayTree)

{
  int in_EDX;
  long in_RSI;
  Container *in_RDI;
  QuadTreeNode *unaff_retaddr;
  Container Cont;
  int divider;
  
  divider = (int)((ulong)in_RSI >> 0x20);
  if (in_EDX == 0) {
    if ((*(uint *)(in_RSI + 0x38) & 0x100) != 0) {
      AddContent(unaff_retaddr,in_RDI,divider);
    }
  }
  else if ((*(uint *)(in_RSI + 0x38) & 1) != 0) {
    AddContent(unaff_retaddr,in_RDI,divider);
  }
  return;
}

Assistant:

void AddObject(struct Level *level, struct Object *NewObject, int DisplayTree)
{
   struct Container Cont;

   Cont.Content.O = NewObject;
   Cont.Type = OBJECT;

   if (DisplayTree) {
      if (NewObject->Flags & OBJFLAGS_VISIBLE)
         AddContent(&level->DisplayTree, &Cont, MAX_DISP);
   } else {
      if (NewObject->Flags & FLAGS_COLLIDABLE)
         AddContent(&level->CollisionTree, &Cont, MAX_COLL);
   }
}